

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O2

QString * __thiscall
QCommandLineParserPrivate::helpText
          (QString *__return_storage_ptr__,QCommandLineParserPrivate *this,bool includeQtOptions)

{
  _Head_base<0UL,_QCoreApplicationPrivate_*,_false> _Var1;
  long lVar2;
  undefined8 uVar3;
  Flags FVar4;
  PositionalArgumentDefinition *arg_1;
  PositionalArgumentDefinition *pPVar5;
  int iVar6;
  PositionalArgumentDefinition *arg;
  QArrayDataPointer<char16_t> *pQVar7;
  int optionNameMaxWidth;
  QChar ch;
  QChar ch_00;
  qsizetype asize;
  long lVar8;
  QCommandLineOption *this_00;
  long lVar9;
  QString *names;
  QCommandLineOption *option;
  QCommandLineOption *pQVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<QString> local_d8;
  QArrayDataPointer<QString> local_b8;
  QArrayDataPointer<QCommandLineOption> local_a0;
  QArrayDataPointer<char16_t> local_88;
  undefined1 local_69 [17];
  QArrayDataPointer<char16_t> *pQStack_58;
  QArrayDataPointer<char16_t> *local_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_69[0] = 10;
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  local_88.size = 0;
  local_88.d = (Data *)0x0;
  local_88.ptr = (char16_t *)0x0;
  if (QCoreApplication::self == (QCoreApplication *)0x0) {
    QString::append((QString *)&local_88,(QChar *)L"<executable_name>",0x11);
  }
  else {
    QCoreApplication::arguments();
    QString::append((QString *)&local_88,(QChar *)((DataPointer *)local_69._9_8_)->ptr,
                    ((DataPointer *)local_69._9_8_)->size);
    QArrayDataPointer<QString>::~QArrayDataPointer
              ((QArrayDataPointer<QString> *)((long)local_69 + 1));
  }
  local_a0.d = (this->commandLineOptionList).d.d;
  local_a0.ptr = (this->commandLineOptionList).d.ptr;
  local_a0.size = (this->commandLineOptionList).d.size;
  if (local_a0.d != (Data *)0x0) {
    LOCK();
    ((local_a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((includeQtOptions) && (QCoreApplication::self != (QCoreApplication *)0x0)) {
    _Var1._M_head_impl =
         (QCoreApplication::self->d_ptr)._M_t.
         super___uniq_ptr_impl<QCoreApplicationPrivate,_std::default_delete<QCoreApplicationPrivate>_>
         ._M_t.
         super__Tuple_impl<0UL,_QCoreApplicationPrivate_*,_std::default_delete<QCoreApplicationPrivate>_>
         .super__Head_base<0UL,_QCoreApplicationPrivate_*,_false>._M_head_impl;
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_QCoreApplicationPrivate + 0x10))
              (_Var1._M_head_impl,&local_a0);
  }
  if (local_a0.size != 0) {
    QCommandLineParser::tr((QString *)&local_b8,"[options]",(char *)0x0,-1);
    local_50 = (QArrayDataPointer<char16_t> *)local_b8.size;
    pQStack_58 = &(local_b8.ptr)->d;
    local_69._9_8_ = local_b8.d;
    local_69._1_2_ = 0x20;
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (QString *)0x0;
    local_b8.size = 0;
    operator+=((QString *)&local_88,(QStringBuilder<char16_t,_QString> *)((long)local_69 + 1));
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(local_69 + 9));
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
  }
  pPVar5 = (this->positionalArgumentDefinitions).d.ptr;
  for (lVar8 = (this->positionalArgumentDefinitions).d.size * 0x48; lVar8 != 0;
      lVar8 = lVar8 + -0x48) {
    local_69._9_8_ = &pPVar5->syntax;
    local_69._1_2_ = 0x20;
    operator+=((QString *)&local_88,
               (QStringBuilder<char16_t,_const_QString_&> *)((long)local_69 + 1));
    pPVar5 = pPVar5 + 1;
  }
  QCommandLineParser::tr((QString *)&local_d8,"Usage: %1",(char *)0x0,-1);
  QString::arg<QString,_true>
            ((QString *)&local_b8,(QString *)&local_d8,(QString *)&local_88,0,(QChar)0x20);
  pQStack_58 = (QArrayDataPointer<char16_t> *)local_b8.size;
  local_69._9_8_ = local_b8.ptr;
  local_69._1_8_ = local_b8.d;
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (QString *)0x0;
  local_b8.size = 0;
  local_50 = (QArrayDataPointer<char16_t> *)local_69;
  operator+=(__return_storage_ptr__,
             (QStringBuilder<QString,_const_QLatin1Char_&> *)((long)local_69 + 1U));
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)((long)local_69 + 1U));
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
  if ((this->description).d.size != 0) {
    local_69._1_8_ = &this->description;
    local_69._9_8_ = (QArrayDataPointer<char16_t> *)local_69;
    operator+=(__return_storage_ptr__,
               (QStringBuilder<const_QString_&,_const_QLatin1Char_&> *)((long)local_69 + 1));
  }
  ch.ucs._1_1_ = 0;
  ch.ucs._0_1_ = local_69[0];
  QString::append(__return_storage_ptr__,ch);
  if (local_a0.size == 0) {
    asize = 0;
  }
  else {
    QCommandLineParser::tr((QString *)&local_b8,"Options:",(char *)0x0,-1);
    pQStack_58 = (QArrayDataPointer<char16_t> *)local_b8.size;
    local_69._9_8_ = local_b8.ptr;
    local_69._1_8_ = local_b8.d;
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (QString *)0x0;
    local_b8.size = 0;
    local_50 = (QArrayDataPointer<char16_t> *)local_69;
    operator+=(__return_storage_ptr__,
               (QStringBuilder<QString,_const_QLatin1Char_&> *)((long)local_69 + 1U));
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)((long)local_69 + 1U));
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
    asize = local_a0.size;
  }
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (QString *)0x0;
  local_b8.size = 0;
  QList<QString>::reserve((QList<QString> *)&local_b8,asize);
  pQVar10 = local_a0.ptr + local_a0.size;
  lVar8 = 0;
  for (this_00 = local_a0.ptr; this_00 != pQVar10; this_00 = this_00 + 1) {
    FVar4 = QCommandLineOption::flags(this_00);
    if (((uint)FVar4.super_QFlagsStorageHelper<QCommandLineOption::Flag,_4>.
               super_QFlagsStorage<QCommandLineOption::Flag>.i & 1) == 0) {
      local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      QCommandLineOption::names((QStringList *)&local_d8,this_00);
      local_f8.size = 0;
      local_f8.d = (Data *)0x0;
      local_f8.ptr = (char16_t *)0x0;
      lVar9 = local_d8.size * 0x18;
      pQVar7 = &(local_d8.ptr)->d;
      for (; lVar9 != 0; lVar9 = lVar9 + -0x18) {
        local_69._9_8_ = (ulong)(pQVar7->size != 1) + 1;
        local_69._1_8_ = "--";
        local_50 = (QArrayDataPointer<char16_t> *)0x173c3f;
        local_48 = 2;
        pQStack_58 = pQVar7;
        operator+=((QString *)&local_f8,
                   (QStringBuilder<QStringBuilder<QLatin1StringView,_const_QString_&>,_QLatin1StringView>
                    *)((long)local_69 + 1U));
        pQVar7 = pQVar7 + 1;
      }
      if ((QArrayDataPointer<char16_t> *)local_d8.size != (QArrayDataPointer<char16_t> *)0x0) {
        QString::chop((QString *)&local_f8,2);
      }
      local_118.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_118.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_118.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QCommandLineOption::valueName((QString *)&local_118,this_00);
      if ((undefined1 *)local_118.size != (undefined1 *)0x0) {
        local_69._1_8_ = " <";
        local_69._9_8_ = (QArrayDataPointer<char16_t> *)0x2;
        pQStack_58 = &local_118;
        local_50 = (QArrayDataPointer<char16_t> *)CONCAT62(local_50._2_6_,0x3e);
        operator+=((QString *)&local_f8,
                   (QStringBuilder<QStringBuilder<QLatin1StringView,_const_QString_&>,_char16_t> *)
                   ((long)local_69 + 1U));
      }
      QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_b8,(QString *)&local_f8);
      if (lVar8 <= local_f8.size) {
        lVar8 = local_f8.size;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_d8);
    }
  }
  pPVar5 = (this->positionalArgumentDefinitions).d.ptr;
  for (lVar9 = (this->positionalArgumentDefinitions).d.size * 0x48; lVar9 != 0;
      lVar9 = lVar9 + -0x48) {
    lVar2 = (pPVar5->name).d.size;
    if (lVar8 <= lVar2) {
      lVar8 = lVar2;
    }
    pPVar5 = pPVar5 + 1;
  }
  iVar6 = (int)lVar8 + 1;
  optionNameMaxWidth = 0x32;
  if (iVar6 < 0x32) {
    optionNameMaxWidth = iVar6;
  }
  uVar3 = (long)local_69 + 1;
  names = local_b8.ptr;
  pQVar10 = local_a0.ptr;
  for (lVar8 = local_a0.size << 3; lVar8 != 0; lVar8 = lVar8 + -8) {
    FVar4 = QCommandLineOption::flags(pQVar10);
    if (((uint)FVar4.super_QFlagsStorageHelper<QCommandLineOption::Flag,_4>.
               super_QFlagsStorage<QCommandLineOption::Flag>.i & 1) == 0) {
      QCommandLineOption::description((QString *)&local_d8,pQVar10);
      wrapText((QString *)uVar3,names,optionNameMaxWidth,(QString *)&local_d8);
      QString::append(__return_storage_ptr__,(QString *)uVar3);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)uVar3);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
      names = names + 1;
    }
    pQVar10 = pQVar10 + 1;
  }
  if ((this->positionalArgumentDefinitions).d.size != 0) {
    if (local_a0.size != 0) {
      ch_00.ucs._1_1_ = 0;
      ch_00.ucs._0_1_ = local_69[0];
      QString::append(__return_storage_ptr__,ch_00);
    }
    QCommandLineParser::tr((QString *)&local_d8,"Arguments:",(char *)0x0,-1);
    pQStack_58 = (QArrayDataPointer<char16_t> *)local_d8.size;
    local_69._9_8_ = local_d8.ptr;
    local_69._1_8_ = local_d8.d;
    local_d8.d = (Data *)0x0;
    local_d8.ptr = (QString *)0x0;
    local_d8.size = 0;
    uVar3 = (long)local_69 + 1;
    local_50 = (QArrayDataPointer<char16_t> *)local_69;
    operator+=(__return_storage_ptr__,(QStringBuilder<QString,_const_QLatin1Char_&> *)uVar3);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)uVar3);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
    pPVar5 = (this->positionalArgumentDefinitions).d.ptr;
    for (lVar8 = (this->positionalArgumentDefinitions).d.size * 0x48; lVar8 != 0;
        lVar8 = lVar8 + -0x48) {
      wrapText((QString *)uVar3,&pPVar5->name,optionNameMaxWidth,&pPVar5->description);
      QString::append(__return_storage_ptr__,(QString *)uVar3);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)uVar3);
      pPVar5 = pPVar5 + 1;
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<QCommandLineOption>::~QArrayDataPointer(&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QCommandLineParserPrivate::helpText(bool includeQtOptions) const
{
    const QLatin1Char nl('\n');
    QString text;
    QString usage;
    // executable name
    usage += qApp ? QStringView(QCoreApplication::arguments().constFirst())
                  : QStringView(u"<executable_name>");
    QList<QCommandLineOption> options = commandLineOptionList;
    if (includeQtOptions && qApp)
        qApp->d_func()->addQtOptions(&options);
    if (!options.isEmpty())
        usage += u' ' + QCommandLineParser::tr("[options]");
    for (const PositionalArgumentDefinition &arg : positionalArgumentDefinitions)
        usage += u' ' + arg.syntax;
    text += QCommandLineParser::tr("Usage: %1").arg(usage) + nl;
    if (!description.isEmpty())
        text += description + nl;
    text += nl;
    if (!options.isEmpty())
        text += QCommandLineParser::tr("Options:") + nl;

    QStringList optionNameList;
    optionNameList.reserve(options.size());
    qsizetype longestOptionNameString = 0;
    for (const QCommandLineOption &option : std::as_const(options)) {
        if (option.flags() & QCommandLineOption::HiddenFromHelp)
            continue;
        const QStringList optionNames = option.names();
        QString optionNamesString;
        for (const QString &optionName : optionNames) {
            const int numDashes = optionName.size() == 1 ? 1 : 2;
            optionNamesString += QLatin1StringView("--", numDashes) + optionName + ", "_L1;
        }
        if (!optionNames.isEmpty())
            optionNamesString.chop(2); // remove trailing ", "
        const auto valueName = option.valueName();
        if (!valueName.isEmpty())
            optionNamesString += " <"_L1 + valueName + u'>';
        optionNameList.append(optionNamesString);
        longestOptionNameString = qMax(longestOptionNameString, optionNamesString.size());
    }

    for (const PositionalArgumentDefinition &arg : positionalArgumentDefinitions)
        longestOptionNameString = qMax(longestOptionNameString, arg.name.size());

    ++longestOptionNameString;
    const int optionNameMaxWidth = qMin(50, int(longestOptionNameString));
    auto optionNameIterator = optionNameList.cbegin();
    for (const QCommandLineOption &option : std::as_const(options)) {
        if (option.flags() & QCommandLineOption::HiddenFromHelp)
            continue;
        text += wrapText(*optionNameIterator, optionNameMaxWidth, option.description());
        ++optionNameIterator;
    }
    if (!positionalArgumentDefinitions.isEmpty()) {
        if (!options.isEmpty())
            text += nl;
        text += QCommandLineParser::tr("Arguments:") + nl;
        for (const PositionalArgumentDefinition &arg : positionalArgumentDefinitions)
            text += wrapText(arg.name, optionNameMaxWidth, arg.description);
    }
    return text;
}